

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyRwr.c
# Opt level: O3

int Ivy_ManRewritePre(Ivy_Man_t *p,int fUpdateLevel,int fUseZeroCost,int fVerbose)

{
  short sVar1;
  char *pcVar2;
  Ivy_Obj_t *pIVar3;
  Vec_Int_t *__ptr;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  Rwt_Man_t *p_00;
  void **ppvVar8;
  Ivy_Obj_t *pIVar9;
  Vec_Ptr_t *pVVar10;
  Dec_Graph_t *pGraph;
  ulong uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  Ivy_Obj_t *pIVar17;
  Ivy_Obj_t *pIVar18;
  Ivy_Cut_t *pIVar19;
  uint uVar20;
  long lVar21;
  int *piVar22;
  int *piVar23;
  int *piVar24;
  void *pvVar25;
  timespec ts;
  timespec local_118;
  int local_104;
  int local_100;
  int local_fc;
  int local_f8;
  undefined4 local_f4;
  Ivy_Cut_t *local_f0;
  long local_e8;
  Ivy_Store_t *local_e0;
  Ivy_Obj_t *local_d8;
  uint local_cc;
  uint local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  ulong local_b0;
  int *local_a8;
  int *local_a0;
  Ivy_Obj_t *local_98;
  Rwt_Man_t *local_90;
  ulong local_88;
  long local_80;
  long local_78;
  long local_70;
  void *local_68;
  long local_60;
  ulong local_58;
  Ivy_Obj_t *local_50;
  long local_48;
  long local_40;
  long local_38;
  
  local_104 = fUpdateLevel;
  local_b8 = fUseZeroCost;
  iVar4 = clock_gettime(3,&local_118);
  if (iVar4 < 0) {
    local_80 = 1;
  }
  else {
    lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_118.tv_nsec),8);
    local_80 = ((lVar13 >> 7) - (lVar13 >> 0x3f)) + local_118.tv_sec * -1000000;
  }
  iVar4 = 0;
  p_00 = Rwt_ManStart(0);
  p->pData = p_00;
  if (p_00 != (Rwt_Man_t *)0x0) {
    if (local_104 != 0) {
      if (p->fFanout == 0) {
        Ivy_ManStartFanout(p);
      }
      Ivy_ManRequiredLevels(p);
    }
    pVVar10 = p->vObjs;
    local_58 = (ulong)pVVar10->nSize;
    local_bc = fVerbose;
    if (0 < (long)local_58) {
      local_50 = &p->Ghost;
      uVar11 = 0;
      local_90 = p_00;
      do {
        pIVar17 = (Ivy_Obj_t *)pVVar10->pArray[uVar11];
        if (((pIVar17 != (Ivy_Obj_t *)0x0) &&
            (0xfffffffd < (*(uint *)&pIVar17->field_0x8 & 0xf) - 7)) &&
           (local_b0 = uVar11, Ivy_NodeFixBufferFanins(p,pIVar17,1), uVar11 = local_b0,
           (*(uint *)&pIVar17->field_0x8 & 0xf) != 7)) {
          if (local_58 <= local_b0) break;
          p_00->nNodesConsidered = p_00->nNodesConsidered + 1;
          if (local_104 == 0) {
            local_b4 = 1000000;
          }
          else {
            iVar4 = pIVar17->Id;
            if (((long)iVar4 < 0) || (p->vRequired->nSize <= iVar4)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            local_b4 = p->vRequired->pArray[iVar4];
          }
          iVar4 = clock_gettime(3,&local_118);
          if (iVar4 < 0) {
            lVar13 = 1;
          }
          else {
            lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_118.tv_nsec),8);
            lVar13 = ((lVar13 >> 7) - (lVar13 >> 0x3f)) + local_118.tv_sec * -1000000;
          }
          local_e0 = Ivy_NodeFindCutsAll(p,pIVar17,5);
          iVar4 = clock_gettime(3,&local_118);
          if (iVar4 < 0) {
            lVar14 = -1;
          }
          else {
            lVar14 = local_118.tv_nsec / 1000 + local_118.tv_sec * 1000000;
          }
          p_00->timeCut = p_00->timeCut + lVar14 + lVar13;
          iVar4 = clock_gettime(3,&local_118);
          if (iVar4 < 0) {
            local_78 = 1;
          }
          else {
            lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_118.tv_nsec),8);
            local_78 = ((lVar13 >> 7) - (lVar13 >> 0x3f)) + local_118.tv_sec * -1000000;
          }
          local_d8 = pIVar17;
          if (local_e0->nCuts < 2) {
            iVar4 = -1;
            uVar16 = 0;
          }
          else {
            pIVar19 = local_e0->pCuts;
            piVar22 = local_e0->pCuts[1].pArray;
            local_cc = 0;
            local_fc = -1;
            lVar13 = 1;
            local_100 = -1;
            local_f0 = pIVar19;
            do {
              if (pIVar19[lVar13].nSize == 4) {
                lVar14 = -0x10;
                do {
                  iVar4 = *(int *)((long)piVar22 + lVar14 + 0x10);
                  local_e8 = lVar13;
                  if (((long)iVar4 < 0) || (p->vObjs->nSize <= iVar4)) goto LAB_007e7ff3;
                  if ((*(uint *)((long)p->vObjs->pArray[iVar4] + 8) & 0xf) == 7) {
                    if (lVar14 != 0) {
                      p_00->nCutsBad = p_00->nCutsBad + 1;
                      pIVar19 = local_f0;
                      goto LAB_007e7cc0;
                    }
                    break;
                  }
                  lVar14 = lVar14 + 4;
                } while (lVar14 != 0);
                p_00->nCutsGood = p_00->nCutsGood + 1;
                local_a0 = piVar22;
                iVar4 = clock_gettime(3,&local_118);
                if (iVar4 < 0) {
                  lVar14 = 1;
                }
                else {
                  lVar14 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_118.tv_nsec),8);
                  lVar14 = ((lVar14 >> 7) - (lVar14 >> 0x3f)) + local_118.tv_sec * -1000000;
                }
                if (5 < pIVar19[lVar13].nSize) {
                  __assert_fail("nNums < 6",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyRwr.c"
                                ,0x15a,"unsigned int Ivy_NodeGetTruth(Ivy_Obj_t *, int *, int)");
                }
                uVar5 = Ivy_NodeGetTruth_rec
                                  (pIVar17,pIVar19[lVar13].pArray,(int)pIVar19[lVar13].nSize);
                iVar4 = clock_gettime(3,&local_118);
                p_00 = local_90;
                if (iVar4 < 0) {
                  lVar15 = -1;
                }
                else {
                  lVar15 = local_118.tv_nsec / 1000 + local_118.tv_sec * 1000000;
                }
                local_90->timeTruth = local_90->timeTruth + lVar15 + lVar14;
                local_88 = (ulong)(uVar5 & 0xffff);
                pcVar2 = local_90->pPerms4[local_90->pPerms[local_88]];
                local_c8 = (uint)local_90->pPhases[local_88];
                pVVar10 = local_90->vFaninsCur;
                pVVar10->nSize = 0;
                sVar1 = pIVar19[lVar13].nSize;
                uVar5 = (uint)sVar1;
                if (pVVar10->nCap < (int)uVar5) {
                  if (pVVar10->pArray == (void **)0x0) {
                    ppvVar8 = (void **)malloc((long)(int)uVar5 << 3);
                  }
                  else {
                    ppvVar8 = (void **)realloc(pVVar10->pArray,(long)(int)uVar5 << 3);
                  }
                  pVVar10->pArray = ppvVar8;
                  pVVar10->nCap = uVar5;
                }
                if (0 < sVar1) {
                  uVar11 = 0;
                  do {
                    pVVar10->pArray[uVar11] = (void *)0x0;
                    uVar11 = uVar11 + 1;
                  } while (uVar5 != uVar11);
                }
                pVVar10->nSize = uVar5;
                sVar1 = pIVar19[lVar13].nSize;
                if (0 < (long)sVar1) {
                  lVar14 = 0;
                  do {
                    iVar4 = pIVar19[lVar13].pArray[pcVar2[lVar14]];
                    if (((long)iVar4 < 0) || (p->vObjs->nSize <= iVar4)) {
LAB_007e7ff3:
                      __assert_fail("i >= 0 && i < p->nSize",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
                    }
                    pvVar25 = p->vObjs->pArray[iVar4];
                    uVar5 = *(uint *)((long)pvVar25 + 8) & 0xf;
                    if (((uVar5 - 7 < 0xfffffffe) && (uVar5 != 1)) && (uVar5 != 4)) {
                      __assert_fail("Ivy_ObjIsNode(pFanin) || Ivy_ObjIsCi(pFanin)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyRwr.c"
                                    ,0xcf,
                                    "int Ivy_NodeRewrite(Ivy_Man_t *, Rwt_Man_t *, Ivy_Obj_t *, int, int)"
                                   );
                    }
                    if (p_00->vFaninsCur->nSize <= lVar14) {
                      __assert_fail("i >= 0 && i < p->nSize",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                                    ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
                    }
                    p_00->vFaninsCur->pArray[lVar14] =
                         (void *)((ulong)pvVar25 ^
                                 (ulong)((local_c8 >> ((uint)lVar14 & 0x1f) & 1) != 0));
                    lVar14 = lVar14 + 1;
                  } while (sVar1 != lVar14);
                }
                iVar4 = clock_gettime(3,&local_118);
                pIVar17 = local_d8;
                if (iVar4 < 0) {
                  lVar13 = 1;
                }
                else {
                  lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_118.tv_nsec),8);
                  lVar13 = ((lVar13 >> 7) - (lVar13 >> 0x3f)) + local_118.tv_sec * -1000000;
                }
                lVar14 = (long)p_00->vFaninsCur->nSize;
                if (0 < lVar14) {
                  ppvVar8 = p_00->vFaninsCur->pArray;
                  lVar15 = 0;
                  do {
                    piVar22 = (int *)(((ulong)ppvVar8[lVar15] & 0xfffffffffffffffe) + 0xc);
                    *piVar22 = *piVar22 + 1;
                    lVar15 = lVar15 + 1;
                  } while (lVar14 != lVar15);
                }
                Ivy_ManIncrementTravId(p);
                iVar4 = Ivy_ObjMffcLabel(p,pIVar17);
                lVar14 = (long)p_00->vFaninsCur->nSize;
                if (0 < lVar14) {
                  ppvVar8 = p_00->vFaninsCur->pArray;
                  lVar15 = 0;
                  do {
                    uVar11 = (ulong)ppvVar8[lVar15] & 0xfffffffffffffffe;
                    iVar7 = *(int *)(uVar11 + 0xc);
                    if (iVar7 < 1) {
                      __assert_fail("pObj->nRefs > 0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivy.h"
                                    ,0x10a,"void Ivy_ObjRefsDec(Ivy_Obj_t *)");
                    }
                    *(int *)(uVar11 + 0xc) = iVar7 + -1;
                    lVar15 = lVar15 + 1;
                  } while (lVar14 != lVar15);
                }
                local_f8 = iVar4;
                iVar4 = clock_gettime(3,&local_118);
                if (iVar4 < 0) {
                  lVar14 = -1;
                }
                else {
                  lVar14 = local_118.tv_nsec / 1000 + local_118.tv_sec * 1000000;
                }
                p_00->timeMffc = p_00->timeMffc + lVar14 + lVar13;
                iVar4 = clock_gettime(3,&local_118);
                if (iVar4 < 0) {
                  local_70 = 1;
                }
                else {
                  lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_118.tv_nsec),8);
                  local_70 = ((lVar13 >> 7) - (lVar13 >> 0x3f)) + local_118.tv_sec * -1000000;
                }
                if (p_00->vClasses->nSize <= (int)(uint)p_00->pMap[local_88]) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecVec.h"
                                ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
                }
                pVVar10 = p_00->vFaninsCur;
                pvVar25 = p_00->vClasses->pArray[p_00->pMap[local_88]];
                iVar4 = *(int *)((long)pvVar25 + 4);
                p_00->nSubgraphs = p_00->nSubgraphs + iVar4;
                pIVar19 = local_f0;
                lVar13 = local_e8;
                if (iVar4 < 1) {
                  piVar24 = (int *)0x0;
                  iVar4 = local_100;
                }
                else {
                  local_c0 = -1;
                  lVar14 = 0;
                  piVar24 = (int *)0x0;
                  iVar4 = local_f8;
                  local_68 = pvVar25;
                  do {
                    piVar22 = *(int **)(*(long *)(*(long *)((long)pvVar25 + 8) + lVar14 * 8) + 0x20)
                    ;
                    if (0 < pVVar10->nSize) {
                      lVar15 = 1;
                      lVar12 = 0;
                      do {
                        *(void **)(*(long *)(piVar22 + 4) + lVar15 * 8) = pVVar10->pArray[lVar12];
                        lVar12 = lVar12 + 1;
                        lVar15 = lVar15 + 3;
                      } while (lVar12 < pVVar10->nSize);
                    }
                    iVar7 = 0;
                    local_38 = lVar14;
                    if (*piVar22 == 0) {
                      iVar7 = 0;
                      if (((uint)piVar22[6] >> 1 & 0x3fffffff) < (uint)piVar22[1])
                      goto LAB_007e7a73;
                      iVar6 = 0;
                      if (piVar22[1] != 0) {
                        lVar14 = 0x10;
                        lVar15 = 0;
                        do {
                          lVar12 = *(long *)(piVar22 + 4);
                          *(uint *)(lVar12 + lVar14) =
                               *(uint *)(lVar12 + lVar14) & 0xffffc000 |
                               *(uint *)((*(ulong *)(lVar12 + -8 + lVar14) & 0xfffffffffffffffe) + 8
                                        ) >> 0xb & 0x3fff;
                          lVar15 = lVar15 + 1;
                          iVar6 = piVar22[1];
                          lVar14 = lVar14 + 0x18;
                        } while (lVar15 < iVar6);
                      }
                      iVar7 = 0;
                      if (piVar22[2] <= iVar6) goto LAB_007e7a73;
                      lVar15 = (long)iVar6;
                      lVar14 = lVar15 * 0x18 + 0x10;
                      local_c4 = 0;
                      local_a8 = piVar24;
                      do {
                        lVar12 = *(long *)(piVar22 + 4);
                        uVar5 = *(uint *)(lVar12 + -0x10 + lVar14);
                        uVar20 = *(uint *)(lVar12 + -0xc + lVar14);
                        uVar11 = (ulong)(uVar5 >> 1 & 0x3fffffff);
                        lVar21 = uVar11 * 3;
                        uVar16 = (ulong)(uVar20 >> 1 & 0x3fffffff);
                        local_40 = uVar16 * 3;
                        pIVar17 = *(Ivy_Obj_t **)(lVar12 + 8 + uVar11 * 0x18);
                        pIVar3 = *(Ivy_Obj_t **)(lVar12 + 8 + uVar16 * 0x18);
                        local_48 = lVar15;
                        if ((pIVar17 == (Ivy_Obj_t *)0x0) || (pIVar3 == (Ivy_Obj_t *)0x0)) {
                          local_f4 = (undefined4)CONCAT71((uint7)(uint3)(uVar5 >> 8),1);
                          pIVar9 = (Ivy_Obj_t *)0x0;
                          local_98 = pIVar3;
LAB_007e79a1:
                          pIVar19 = local_f0;
                          piVar24 = local_a8;
                          lVar13 = local_e8;
                          if (iVar4 <= local_c4) goto LAB_007e7a8f;
                          local_c4 = local_c4 + 1;
                          pIVar18 = pIVar17;
                        }
                        else {
                          piVar24 = (int *)((ulong)pIVar17 & 0xfffffffffffffffe);
                          local_60 = lVar21;
                          if (*piVar24 == 0) {
                            __assert_fail("Type != IVY_AND || !Ivy_ObjIsConst1(Ivy_Regular(p0))",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivy.h"
                                          ,0x137,
                                          "Ivy_Obj_t *Ivy_ObjCreateGhost(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *, Ivy_Type_t, Ivy_Init_t)"
                                         );
                          }
                          pIVar9 = (Ivy_Obj_t *)(ulong)(uVar20 & 1);
                          piVar23 = (int *)0x0;
                          if ((pIVar9 != pIVar3) &&
                             (piVar23 = (int *)((ulong)pIVar3 & 0xfffffffffffffffe), *piVar23 == 0))
                          {
                            __assert_fail("p1 == NULL || !Ivy_ObjIsConst1(Ivy_Regular(p1))",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivy.h"
                                          ,0x138,
                                          "Ivy_Obj_t *Ivy_ObjCreateGhost(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *, Ivy_Type_t, Ivy_Init_t)"
                                         );
                          }
                          local_f4 = (undefined4)CONCAT71((int7)((ulong)local_40 >> 8),1);
                          if (piVar24 == piVar23) {
                            __assert_fail("Type == IVY_PI || Ivy_Regular(p0) != Ivy_Regular(p1)",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivy.h"
                                          ,0x139,
                                          "Ivy_Obj_t *Ivy_ObjCreateGhost(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *, Ivy_Type_t, Ivy_Init_t)"
                                         );
                          }
                          pIVar18 = (Ivy_Obj_t *)((ulong)pIVar17 ^ (ulong)(uVar5 & 1));
                          local_98 = (Ivy_Obj_t *)((ulong)pIVar3 ^ (ulong)pIVar9);
                          *(uint *)&(p->Ghost).field_0x8 =
                               *(uint *)&(p->Ghost).field_0x8 & 0xfffff9f0 | 5;
                          (p->Ghost).pFanin0 = pIVar18;
                          (p->Ghost).pFanin1 = local_98;
                          if (pIVar9 != pIVar3) {
                            iVar4 = 0;
                            if ((Ivy_Obj_t *)(ulong)(uVar5 & 1) != pIVar17) {
                              iVar4 = *piVar24;
                            }
                            if (*piVar23 < iVar4) {
                              (p->Ghost).pFanin0 = local_98;
                              (p->Ghost).pFanin1 = pIVar18;
                            }
                          }
                          pIVar9 = Ivy_TableLookup(p,local_50);
                          pIVar19 = local_f0;
                          pvVar25 = local_68;
                          piVar24 = local_a8;
                          lVar13 = local_e8;
                          iVar4 = local_f8;
                          if (local_d8 == (Ivy_Obj_t *)((ulong)pIVar9 & 0xfffffffffffffffe))
                          goto LAB_007e7a8f;
                          pIVar17 = pIVar18;
                          lVar21 = local_60;
                          if (pIVar9 == (Ivy_Obj_t *)0x0) {
                            pIVar9 = (Ivy_Obj_t *)0x0;
                            goto LAB_007e79a1;
                          }
                          local_f4 = 0;
                          if (((Ivy_Obj_t *)((ulong)pIVar9 & 0xfffffffffffffffe))->TravId ==
                              p->nTravIds) goto LAB_007e79a1;
                        }
                        uVar20 = *(uint *)(lVar12 + lVar21 * 8 + 0x10) & 0x3fff;
                        uVar5 = *(uint *)(lVar12 + local_40 * 8 + 0x10) & 0x3fff;
                        if (uVar5 < uVar20) {
                          uVar5 = uVar20;
                        }
                        uVar5 = uVar5 + 1;
                        if ((char)local_f4 == '\0') {
                          pIVar17 = (Ivy_Obj_t *)((ulong)pIVar9 & 0xfffffffffffffffe);
                          if (p->pConst1 == pIVar17) {
                            uVar5 = 0;
                          }
                          else if ((pIVar17 == (Ivy_Obj_t *)((ulong)pIVar18 & 0xfffffffffffffffe))
                                  || (pIVar17 == (Ivy_Obj_t *)((ulong)local_98 & 0xfffffffffffffffe)
                                     )) {
                            uVar5 = *(uint *)&pIVar17->field_0x8 >> 0xb;
                          }
                        }
                        pIVar19 = local_f0;
                        piVar24 = local_a8;
                        lVar13 = local_e8;
                        if (local_b4 < (int)uVar5) goto LAB_007e7a8f;
                        *(Ivy_Obj_t **)(lVar12 + -8 + lVar14) = pIVar9;
                        *(uint *)(lVar12 + lVar14) =
                             *(uint *)(lVar12 + lVar14) & 0xffffc000 | uVar5 & 0x3fff;
                        lVar15 = local_48 + 1;
                        lVar14 = lVar14 + 0x18;
                      } while (lVar15 < piVar22[2]);
                      iVar7 = local_c4;
                      if (local_c4 != -1) goto LAB_007e7a73;
                    }
                    else {
LAB_007e7a73:
                      iVar6 = iVar4 - iVar7;
                      if (iVar4 < iVar7) {
                        __assert_fail("nNodesSaved >= nNodesAdded",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyRwr.c"
                                      ,0x180,
                                      "Dec_Graph_t *Rwt_CutEvaluate(Ivy_Man_t *, Rwt_Man_t *, Ivy_Obj_t *, Vec_Ptr_t *, int, int, int *, unsigned int)"
                                     );
                      }
                      if (local_c0 < iVar6) {
                        piVar24 = piVar22;
                      }
                      if (local_c0 <= iVar6) {
                        local_c0 = iVar6;
                      }
                    }
LAB_007e7a8f:
                    lVar14 = local_38 + 1;
                  } while (lVar14 < *(int *)((long)pvVar25 + 4));
                  p_00 = local_90;
                  iVar4 = local_c0;
                  if (local_c0 == -1) {
                    piVar24 = (int *)0x0;
                    iVar4 = local_100;
                  }
                }
                local_100 = iVar4;
                iVar4 = clock_gettime(3,&local_118);
                if (iVar4 < 0) {
                  lVar14 = -1;
                }
                else {
                  lVar14 = local_118.tv_nsec / 1000 + local_118.tv_sec * 1000000;
                }
                p_00->timeEval = p_00->timeEval + lVar14 + local_70;
                piVar22 = local_a0;
                pIVar17 = local_d8;
                if ((piVar24 != (int *)0x0) && (local_fc < local_100)) {
                  p_00->pGraph = piVar24;
                  p_00->fCompl = local_c8 >> 4 & 1;
                  p_00->vFanins->nSize = 0;
                  pVVar10 = p_00->vFaninsCur;
                  if (pVVar10->nSize < 1) {
                    local_cc = (uint)local_88;
                    local_fc = local_100;
                  }
                  else {
                    lVar13 = 0;
                    do {
                      pvVar25 = pVVar10->pArray[lVar13];
                      pVVar10 = p_00->vFanins;
                      uVar5 = pVVar10->nSize;
                      if (uVar5 == pVVar10->nCap) {
                        if ((int)uVar5 < 0x10) {
                          if (pVVar10->pArray == (void **)0x0) {
                            ppvVar8 = (void **)malloc(0x80);
                          }
                          else {
                            ppvVar8 = (void **)realloc(pVVar10->pArray,0x80);
                          }
                          pVVar10->pArray = ppvVar8;
                          pVVar10->nCap = 0x10;
                          piVar22 = local_a0;
                        }
                        else {
                          if (pVVar10->pArray == (void **)0x0) {
                            ppvVar8 = (void **)malloc((ulong)uVar5 << 4);
                          }
                          else {
                            ppvVar8 = (void **)realloc(pVVar10->pArray,(ulong)uVar5 << 4);
                          }
                          pVVar10->pArray = ppvVar8;
                          pVVar10->nCap = uVar5 * 2;
                          piVar22 = local_a0;
                        }
                      }
                      else {
                        ppvVar8 = pVVar10->pArray;
                      }
                      iVar4 = pVVar10->nSize;
                      pVVar10->nSize = iVar4 + 1;
                      ppvVar8[iVar4] = pvVar25;
                      lVar13 = lVar13 + 1;
                      pVVar10 = p_00->vFaninsCur;
                    } while (lVar13 < pVVar10->nSize);
                    local_cc = (uint)local_88;
                    local_fc = local_100;
                    pIVar19 = local_f0;
                    pIVar17 = local_d8;
                    lVar13 = local_e8;
                  }
                }
              }
LAB_007e7cc0:
              lVar13 = lVar13 + 1;
              piVar22 = piVar22 + 9;
            } while (lVar13 < local_e0->nCuts);
            uVar16 = (ulong)local_cc;
            iVar4 = local_fc;
          }
          iVar7 = clock_gettime(3,&local_118);
          if (iVar7 < 0) {
            lVar13 = -1;
          }
          else {
            lVar13 = local_118.tv_nsec / 1000 + local_118.tv_sec * 1000000;
          }
          p_00->timeRes = p_00->timeRes + lVar13 + local_78;
          uVar11 = local_b0;
          if (iVar4 != -1) {
            pVVar10 = p_00->vFanins;
            if (0 < pVVar10->nSize) {
              lVar13 = 1;
              lVar14 = 0;
              do {
                *(void **)(*(long *)((long)p_00->pGraph + 0x10) + lVar13 * 8) =
                     pVVar10->pArray[lVar14];
                lVar14 = lVar14 + 1;
                pVVar10 = p_00->vFanins;
                lVar13 = lVar13 + 3;
              } while (lVar14 < pVVar10->nSize);
            }
            p_00->nScores[p_00->pMap[uVar16]] = p_00->nScores[p_00->pMap[uVar16]] + 1;
            p_00->nNodesGained = p_00->nNodesGained + iVar4;
            if ((local_b8 != 0) || (0 < iVar4)) {
              p_00->nNodesRewritten = p_00->nNodesRewritten + 1;
              if ((0 < iVar4) || (local_b8 != 0 && iVar4 == 0)) {
                pGraph = (Dec_Graph_t *)Rwt_ManReadDecs(p_00);
                iVar7 = Rwt_ManReadCompl(p_00);
                iVar6 = clock_gettime(3,&local_118);
                if (iVar6 < 0) {
                  lVar13 = 1;
                }
                else {
                  lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_118.tv_nsec),8);
                  lVar13 = ((lVar13 >> 7) - (lVar13 >> 0x3f)) + local_118.tv_sec * -1000000;
                }
                if (iVar7 == 0) {
                  Ivy_GraphUpdateNetwork(p,local_d8,pGraph,local_104,iVar4);
                }
                else {
                  *(byte *)&pGraph->eRoot = *(byte *)&pGraph->eRoot ^ 1;
                  Ivy_GraphUpdateNetwork(p,local_d8,pGraph,local_104,iVar4);
                  *(byte *)&pGraph->eRoot = *(byte *)&pGraph->eRoot ^ 1;
                }
                iVar4 = clock_gettime(3,&local_118);
                p_00 = local_90;
                if (iVar4 < 0) {
                  lVar14 = -1;
                }
                else {
                  lVar14 = local_118.tv_nsec / 1000 + local_118.tv_sec * 1000000;
                }
                Rwt_ManAddTimeUpdate(local_90,lVar14 + lVar13);
                uVar11 = local_b0;
              }
            }
          }
        }
        uVar11 = uVar11 + 1;
        pVVar10 = p->vObjs;
      } while ((long)uVar11 < (long)pVVar10->nSize);
    }
    iVar7 = clock_gettime(3,&local_118);
    iVar4 = local_bc;
    if (iVar7 < 0) {
      lVar13 = -1;
    }
    else {
      lVar13 = local_118.tv_nsec / 1000 + local_118.tv_sec * 1000000;
    }
    Rwt_ManAddTimeTotal(p_00,lVar13 + local_80);
    if (iVar4 != 0) {
      Rwt_ManPrintStats(p_00);
    }
    Rwt_ManStop(p_00);
    p->pData = (void *)0x0;
    if (local_104 == 0) {
      Ivy_ManResetLevels(p);
    }
    else {
      __ptr = p->vRequired;
      piVar22 = __ptr->pArray;
      if (piVar22 != (int *)0x0) {
        free(piVar22);
      }
      free(__ptr);
      p->vRequired = (Vec_Int_t *)0x0;
    }
    uVar5 = Ivy_ManCleanup(p);
    if (uVar5 != 0) {
      printf("Cleanup after rewriting removed %d dangling nodes.\n",(ulong)uVar5);
    }
    iVar7 = Ivy_ManCheck(p);
    iVar4 = 1;
    if (iVar7 == 0) {
      puts("Ivy_ManRewritePre(): The check has failed.");
    }
  }
  return iVar4;
}

Assistant:

int Ivy_ManRewritePre( Ivy_Man_t * p, int fUpdateLevel, int fUseZeroCost, int fVerbose )
{
    Rwt_Man_t * pManRwt;
    Ivy_Obj_t * pNode;
    int i, nNodes, nGain;
    abctime clk, clkStart = Abc_Clock();
    // start the rewriting manager
    pManRwt = Rwt_ManStart( 0 );
    p->pData = pManRwt;
    if ( pManRwt == NULL )
        return 0; 
    // create fanouts
    if ( fUpdateLevel && p->fFanout == 0 )
        Ivy_ManStartFanout( p );
    // compute the reverse levels if level update is requested
    if ( fUpdateLevel )
        Ivy_ManRequiredLevels( p );
    // set the number of levels
//    p->nLevelMax = Ivy_ManLevels( p );
    // resynthesize each node once
    nNodes = Ivy_ManObjIdMax(p);
    Ivy_ManForEachNode( p, pNode, i )
    {
        // fix the fanin buffer problem
        Ivy_NodeFixBufferFanins( p, pNode, 1 );
        if ( Ivy_ObjIsBuf(pNode) )
            continue;
        // stop if all nodes have been tried once
        if ( i > nNodes )
            break;
        // for each cut, try to resynthesize it
        nGain = Ivy_NodeRewrite( p, pManRwt, pNode, fUpdateLevel, fUseZeroCost );
        if ( nGain > 0 || (nGain == 0 && fUseZeroCost) )
        {
            Dec_Graph_t * pGraph = (Dec_Graph_t *)Rwt_ManReadDecs(pManRwt);
            int fCompl           = Rwt_ManReadCompl(pManRwt);
/*
            {
                Ivy_Obj_t * pObj;
                int i;
                printf( "USING: (" );
                Vec_PtrForEachEntry( Ivy_Obj_t *, Rwt_ManReadLeaves(pManRwt), pObj, i )
                    printf( "%d ", Ivy_ObjFanoutNum(Ivy_Regular(pObj)) );
                printf( ")   Gain = %d.\n", nGain );
            }
            if ( nGain > 0 )
            { // print stats on the MFFC
                extern void Ivy_NodeMffcConeSuppPrint( Ivy_Obj_t * pNode );
                printf( "Node %6d : Gain = %4d  ", pNode->Id, nGain );
                Ivy_NodeMffcConeSuppPrint( pNode );
            }
*/
            // complement the FF if needed
clk = Abc_Clock();
            if ( fCompl ) Dec_GraphComplement( pGraph );
            Ivy_GraphUpdateNetwork( p, pNode, pGraph, fUpdateLevel, nGain );
            if ( fCompl ) Dec_GraphComplement( pGraph );
Rwt_ManAddTimeUpdate( pManRwt, Abc_Clock() - clk );
        }
    }
Rwt_ManAddTimeTotal( pManRwt, Abc_Clock() - clkStart );
    // print stats
    if ( fVerbose )
        Rwt_ManPrintStats( pManRwt );
    // delete the managers
    Rwt_ManStop( pManRwt );
    p->pData = NULL;
    // fix the levels
    if ( fUpdateLevel )
        Vec_IntFree( p->vRequired ), p->vRequired = NULL;
    else
        Ivy_ManResetLevels( p );
    // check
    if ( (i = Ivy_ManCleanup(p)) )
        printf( "Cleanup after rewriting removed %d dangling nodes.\n", i );
    if ( !Ivy_ManCheck(p) )
        printf( "Ivy_ManRewritePre(): The check has failed.\n" );
    return 1;
}